

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::
     ReadPackedPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
               (CodedInputStream *input,RepeatedField<bool> *values)

{
  uint8 uVar1;
  uint8 *puVar2;
  Limit limit;
  int iVar3;
  bool bVar4;
  pair<unsigned_long,_bool> pVar5;
  
  puVar2 = input->buffer_;
  if ((puVar2 < input->buffer_end_) && (iVar3 = (int)(char)*puVar2, -1 < (char)*puVar2)) {
    input->buffer_ = puVar2 + 1;
    bVar4 = true;
  }
  else {
    iVar3 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
    bVar4 = -1 < iVar3;
  }
  if (bVar4) {
    limit = io::CodedInputStream::PushLimit(input,iVar3);
    iVar3 = io::CodedInputStream::BytesUntilLimit(input);
    while (0 < iVar3) {
      puVar2 = input->buffer_;
      if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (long)(char)uVar1)) {
        input->buffer_ = puVar2 + 1;
        pVar5._8_8_ = 1;
        pVar5.first = (long)(char)uVar1;
      }
      else {
        pVar5 = io::CodedInputStream::ReadVarint64Fallback(input);
      }
      if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
      goto LAB_00247df6;
      if (values->current_size_ == values->total_size_) {
        RepeatedField<bool>::Reserve(values,values->total_size_ + 1);
      }
      iVar3 = values->current_size_;
      values->current_size_ = iVar3 + 1;
      values->rep_->elements[iVar3] = pVar5.first != 0;
      iVar3 = io::CodedInputStream::BytesUntilLimit(input);
    }
    io::CodedInputStream::PopLimit(input,limit);
    bVar4 = true;
  }
  else {
LAB_00247df6:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

inline bool WireFormatLite::ReadPackedPrimitive(io::CodedInputStream* input,
                                                RepeatedField<CType>* values) {
  int length;
  if (!input->ReadVarintSizeAsInt(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    CType value;
    if (!ReadPrimitive<CType, DeclaredType>(input, &value)) return false;
    values->Add(value);
  }
  input->PopLimit(limit);
  return true;
}